

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEPlanet.cpp
# Opt level: O1

CEPlanet * CEPlanet::Pluto(void)

{
  CEPlanet *in_RDI;
  allocator local_69;
  CEAngle local_68;
  CEAngle local_58;
  CESkyCoordType local_44;
  string local_40;
  double local_20;
  double local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Pluto",&local_69);
  local_18 = 0.0;
  CEAngle::CEAngle(&local_58,&local_18);
  local_20 = 0.0;
  CEAngle::CEAngle(&local_68,&local_20);
  local_44 = CIRS;
  CEPlanet(in_RDI,&local_40,&local_58,&local_68,&local_44);
  CEAngle::~CEAngle(&local_68);
  CEAngle::~CEAngle(&local_58);
  std::__cxx11::string::~string((string *)&local_40);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_69);
  SetSemiMajorAxis_AU(in_RDI,39.48686035,0.00449751);
  SetEccentricity(in_RDI,0.24885238,6.016e-05);
  SetInclination(in_RDI,17.1410426,5.01e-06,DEGREES);
  SetMeanLongitude(in_RDI,238.96535011,145.18042903,DEGREES);
  SetPerihelionLongitude(in_RDI,224.09702598,-0.00968827,DEGREES);
  SetAscendingNodeLongitude(in_RDI,110.30167986,-0.00809981,DEGREES);
  SetExtraTerms(in_RDI,-0.01262724,0.0,0.0,0.0);
  SetMeanRadius_m(in_RDI,1195000.0);
  SetAlbedo(in_RDI,0.3);
  SetMass_kg(in_RDI,1.307e+22);
  local_40._M_dataplus._M_p = (pointer)0x4022000000000000;
  SetSofaID(in_RDI,(double *)&local_40);
  return in_RDI;
}

Assistant:

CEPlanet CEPlanet::Pluto()
{
    CEPlanet pluto("Pluto", 0.0, 0.0) ;
    pluto.SetSemiMajorAxis_AU(39.48686035, 0.00449751) ;
    pluto.SetEccentricity(0.24885238, 0.00006016) ;
    pluto.SetInclination(17.14104260, 0.00000501, CEAngleType::DEGREES) ;
    pluto.SetMeanLongitude(238.96535011, 145.18042903, CEAngleType::DEGREES) ;
    pluto.SetPerihelionLongitude(224.09702598, -0.00968827, CEAngleType::DEGREES) ;
    pluto.SetAscendingNodeLongitude(110.30167986, -0.00809981, CEAngleType::DEGREES) ;
    
    pluto.SetExtraTerms(-0.01262724, 0.0, 0.0, 0.0) ;
    
    // Set planetary properties
    pluto.SetMeanRadius_m(1195000.0) ;
    pluto.SetAlbedo(0.3) ;
    pluto.SetMass_kg(1.307E22) ;
    
    // Set the sofa planet ID
    // Note that Pluto's positions cannot be computed via the SOFA method
    pluto.SetSofaID(9) ;
    
    return pluto ;
}